

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::clear_children_counters
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,subtree_ref t,size_t begin,size_t end)

{
  value_type vVar1;
  word_type value;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *this_00;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  size_t prev_rank;
  size_t prev_size;
  size_t last_rank;
  size_t last_size;
  size_t keys_end;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  subtree_ref_base<false> *in_stack_fffffffffffffef0;
  int local_108;
  int local_104;
  size_t in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  subtree_ref_base<false> *in_stack_ffffffffffffff30;
  ulong local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::min<unsigned_long>(&local_18,(unsigned_long *)(in_RDI + 0x20));
  if (local_18 < *(ulong *)(in_RDI + 0x20)) {
    subtree_ref_base<false>::sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    item_reference::operator_cast_to_unsigned_long
              ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                *)0x155dcb);
  }
  if (local_18 < *(ulong *)(in_RDI + 0x20)) {
    subtree_ref_base<false>::ranks(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    item_reference::operator_cast_to_unsigned_long
              ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                *)0x155e33);
  }
  if (local_10 == 0) {
    local_104 = 0;
  }
  else {
    subtree_ref_base<false>::sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    vVar1 = item_reference::operator_cast_to_unsigned_long
                      ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                        *)0x155e93);
    local_104 = (int)vVar1;
  }
  value = (word_type)local_104;
  if (local_10 == 0) {
    local_108 = 0;
  }
  else {
    subtree_ref_base<false>::ranks(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    vVar1 = item_reference::operator_cast_to_unsigned_long
                      ((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                        *)0x155eed);
    local_108 = (int)vVar1;
  }
  this_00 = (range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
             *)(long)local_108;
  subtree_ref_base<false>::sizes
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator=(in_stack_fffffffffffffee0,value);
  subtree_ref_base<false>::ranks
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator=(this_00,value);
  subtree_ref_base<false>::sizes
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator-=(this_00,value);
  subtree_ref_base<false>::ranks
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  ::operator-=(this_00,value);
  return;
}

Assistant:

void bt_impl<W, AP>::clear_children_counters(subtree_ref t,
                                                     size_t begin,
                                                     size_t end) const
        {
            size_t keys_end = min(end, degree);
            size_t last_size = end < degree ? t.sizes(end - 1)   : size;
            size_t last_rank = end < degree ? t.ranks(end - 1)   : rank;
            size_t prev_size = begin > 0    ? t.sizes(begin - 1) : 0;
            size_t prev_rank = begin > 0    ? t.ranks(begin - 1) : 0;
            
            assert(last_size >= prev_size);
            assert(last_rank >= prev_rank);
            
            t.sizes(begin, keys_end)   = prev_size;
            t.ranks(begin, keys_end)   = prev_rank;
            
            t.sizes(keys_end, degree) -= last_size - prev_size;
            t.ranks(keys_end, degree) -= last_rank - prev_rank;
        }